

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall gulps::gulps_print_output::log_message(gulps_print_output *this,message *msg)

{
  color cVar1;
  size_t in_RCX;
  string_view format_str;
  string_view format_str_00;
  string local_38;
  
  if (this->text_only == false) {
    cVar1 = this->hdr_color;
    gulps::message::print_message_abi_cxx11_(&local_38,msg,false);
    format_str.size_ = in_RCX;
    format_str.data_ = (char *)local_38._M_string_length;
    fmt::v5::print<>((v5 *)(ulong)((cVar1 & red) >> 0x10 | cVar1 & lime | cVar1 << 0x10),
                     SUB83(local_38._M_dataplus._M_p,0),format_str);
    std::__cxx11::string::~string((string *)&local_38);
  }
  cVar1 = msg->clr;
  gulps::message::print_text_abi_cxx11_(&local_38,msg);
  format_str_00.size_ = in_RCX;
  format_str_00.data_ = (char *)local_38._M_string_length;
  fmt::v5::print<>((v5 *)(ulong)((cVar1 & red) >> 0x10 | cVar1 & lime | cVar1 << 0x10),
                   SUB83(local_38._M_dataplus._M_p,0),format_str_00);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void log_message(const message& msg) override
		{
			if(!text_only)
				fmt::print(hdr_color, msg.print_message(false));
			fmt::print(msg.clr, msg.print_text());
		}